

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

bool DivisionCornerCaseHelper2<short,_long_long,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
     ::DivisionCornerCase2
               (longlong lhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs,
               SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *result)

{
  bool bVar1;
  short sVar2;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *pSVar3;
  short *in_RDX;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *in_RDI;
  short tmp;
  undefined6 in_stack_ffffffffffffffe0;
  short in_stack_ffffffffffffffe6;
  SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *this;
  
  this = in_RDI;
  pSVar3 = (SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
           std::numeric_limits<long_long>::min();
  if ((in_RDI == pSVar3) &&
     (sVar2 = ::SafeInt::operator_cast_to_short
                        ((SafeInt<short,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0)), sVar2 == -1
     )) {
    bVar1 = div_negate_min<short,_long_long,_false>::Value((short *)&stack0xffffffffffffffe6);
    if (bVar1) {
      SafeInt<short,safeint_exception_handlers::SafeInt_InvalidParameter>::operator=(this,in_RDX);
      return true;
    }
    safeint_exception_handlers::SafeInt_InvalidParameter::SafeIntOnOverflow();
  }
  return false;
}

Assistant:

static bool DivisionCornerCase2( U lhs, SafeInt< T, E > rhs, SafeInt<T, E>& result ) SAFEINT_CPP_THROW
    {
        if( lhs == std::numeric_limits< U >::min() && (T)rhs == -1 )
        {
            // corner case of a corner case - lhs = min int, rhs = -1,
            // but rhs is the return type, so in essence, we can return -lhs
            // if rhs is a larger type than lhs
            // If types are wrong, throws
            T tmp = 0;

            if (div_negate_min< T, U, sizeof(U) < sizeof(T) > ::Value(tmp))
                result = tmp;
            else
                E::SafeIntOnOverflow();

            return true;
        }

        return false;
    }